

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
::rebalance_right_to_left
          (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
           *this,int to_move,
          btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
          *right,allocator_type *alloc)

{
  allocator_type *paVar1;
  allocator_type *this_00;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  field_type fVar5;
  int iVar6;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbVar7;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbVar8;
  slot_type *psVar9;
  slot_type *psVar10;
  slot_type *result;
  int local_38;
  int local_34;
  int i_1;
  int i;
  allocator_type *local_28;
  allocator_type *alloc_local;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *right_local;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbStack_10;
  int to_move_local;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *this_local;
  
  local_28 = alloc;
  alloc_local = (allocator_type *)right;
  right_local._4_4_ = to_move;
  pbStack_10 = this;
  pbVar7 = parent(this);
  pbVar8 = parent((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                   *)alloc_local);
  if (pbVar7 != pbVar8) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x87f,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>]"
                 );
  }
  bVar2 = position(this);
  bVar3 = position((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                    *)alloc_local);
  if (bVar2 + 1 != (uint)bVar3) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x880,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>]"
                 );
  }
  bVar2 = count((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)alloc_local);
  bVar3 = count(this);
  iVar6 = right_local._4_4_;
  if (bVar2 < bVar3) {
    __assert_fail("right->count() >= count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x881,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>]"
                 );
  }
  if (right_local._4_4_ < 1) {
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x882,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>]"
                 );
  }
  bVar2 = count((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)alloc_local);
  if ((int)(uint)bVar2 < iVar6) {
    __assert_fail("to_move <= right->count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x883,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>]"
                 );
  }
  bVar2 = count(this);
  paVar1 = local_28;
  pbVar7 = parent(this);
  bVar3 = position(this);
  _i_1 = slot(pbVar7,(ulong)bVar3);
  btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
  ::value_init<phmap::priv::map_slot_type<int,int>*>
            ((btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
              *)this,(ulong)bVar2,paVar1,(map_slot_type<int,_int> **)&i_1);
  paVar1 = alloc_local;
  iVar6 = right_local._4_4_ + -1;
  bVar2 = count(this);
  uninitialized_move_n
            ((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
              *)paVar1,(long)iVar6,0,(long)(int)(bVar2 + 1),this,local_28);
  paVar1 = local_28;
  psVar9 = slot((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)alloc_local,(long)(right_local._4_4_ + -1));
  pbVar7 = parent(this);
  bVar2 = position(this);
  psVar10 = slot(pbVar7,(ulong)bVar2);
  common_params<int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true,_phmap::priv::map_slot_policy<int,_int>_>
  ::move(paVar1,psVar9,psVar10);
  paVar1 = local_28;
  psVar9 = slot((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)alloc_local,(long)right_local._4_4_);
  this_00 = alloc_local;
  bVar2 = count((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)alloc_local);
  psVar10 = slot((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                  *)this_00,(ulong)bVar2);
  result = slot((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)alloc_local,0);
  common_params<int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true,_phmap::priv::map_slot_policy<int,_int>_>
  ::move(paVar1,psVar9,psVar10,result);
  paVar1 = alloc_local;
  bVar2 = count((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)alloc_local);
  value_destroy_n((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                   *)paVar1,(long)(int)((uint)bVar2 - right_local._4_4_),(long)right_local._4_4_,
                  local_28);
  bVar4 = leaf(this);
  if (!bVar4) {
    for (local_34 = 0; local_34 < right_local._4_4_; local_34 = local_34 + 1) {
      bVar2 = count(this);
      pbVar7 = child((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                      *)alloc_local,(long)local_34);
      init_child(this,(uint)bVar2 + local_34 + 1,pbVar7);
    }
    for (local_38 = 0;
        bVar2 = count((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                       *)alloc_local), local_38 <= (int)((uint)bVar2 - right_local._4_4_);
        local_38 = local_38 + 1) {
      iVar6 = local_38 + right_local._4_4_;
      bVar2 = max_count((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                         *)alloc_local);
      paVar1 = alloc_local;
      if ((int)(uint)bVar2 < iVar6) {
        __assert_fail("i + to_move <= right->max_count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x89c,
                      "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>]"
                     );
      }
      pbVar7 = child((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                      *)alloc_local,(long)(local_38 + right_local._4_4_));
      init_child((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                  *)paVar1,local_38,pbVar7);
      clear_child((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                   *)alloc_local,(long)(local_38 + right_local._4_4_));
    }
  }
  fVar5 = count(this);
  set_count(this,fVar5 + (char)right_local._4_4_);
  paVar1 = alloc_local;
  fVar5 = count((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)alloc_local);
  set_count((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
             *)paVar1,fVar5 - (char)right_local._4_4_);
  return;
}

Assistant:

void btree_node<P>::rebalance_right_to_left(const int to_move,
                                                btree_node *right,
                                                allocator_type *alloc) {
        assert(parent() == right->parent());
        assert(position() + 1 == right->position());
        assert(right->count() >= count());
        assert(to_move >= 1);
        assert(to_move <= right->count());

        // 1) Move the delimiting value in the parent to the left node.
        value_init(count(), alloc, parent()->slot(position()));

        // 2) Move the (to_move - 1) values from the right node to the left node.
        right->uninitialized_move_n(to_move - 1, 0, count() + 1, this, alloc);

        // 3) Move the new delimiting value to the parent from the right node.
        params_type::move(alloc, right->slot(to_move - 1),
                          parent()->slot(position()));

        // 4) Shift the values in the right node to their correct position.
        params_type::move(alloc, right->slot(to_move), right->slot(right->count()),
                          right->slot(0));

        // 5) Destroy the now-empty to_move entries in the right node.
        right->value_destroy_n(right->count() - to_move, to_move, alloc);

        if (!leaf()) {
            // Move the child pointers from the right to the left node.
            for (int i = 0; i < to_move; ++i) {
                init_child(count() + i + 1, right->child(i));
            }
            for (int i = 0; i <= right->count() - to_move; ++i) {
                assert(i + to_move <= right->max_count());
                right->init_child(i, right->child(i + to_move));
                right->clear_child(i + to_move);
            }
        }

        // Fixup the counts on the left and right nodes.
        set_count((field_type)(count() + to_move));
        right->set_count((field_type)(right->count() - to_move));
    }